

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPasvDataTransfer.cpp
# Opt level: O1

int __thiscall CPasvDataTransfer::GetIpAndPort(CPasvDataTransfer *this,string *ip)

{
  short *psVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  ostream *poVar6;
  char addressBuffer [16];
  ifaddrs *ifAddrStruct;
  socklen_t len;
  sockaddr_in sin;
  long local_78;
  short local_70;
  long *local_60;
  socklen_t local_54;
  sockaddr local_50;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_54 = 0x10;
  iVar2 = getsockname(this->m_Sock,&local_50,&local_54);
  if (iVar2 == 0) {
    local_60 = (long *)0x0;
    getifaddrs(&local_60);
    for (; local_60 != (long *)0x0; local_60 = (long *)*local_60) {
      psVar1 = (short *)local_60[3];
      if (*psVar1 == 2) {
        bzero(&local_78,0x10);
        inet_ntop(2,psVar1 + 2,(char *)&local_78,0x10);
        if ((local_70 != 0x31 || local_78 != 0x2e302e302e373231) &&
           (sVar3 = strlen((char *)&local_78), 1 < sVar3)) break;
      }
    }
    sVar3 = strlen((char *)&local_78);
    if (1 < sVar3) {
      local_40[0] = local_30;
      sVar3 = strlen((char *)&local_78);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,&local_78,(long)&local_78 + sVar3);
      std::__cxx11::string::operator=((string *)ip,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0]);
      }
      return (int)(ushort)(local_50.sa_data._0_2_ << 8 | (ushort)local_50.sa_data._0_2_ >> 8);
    }
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "Get local ip error,now exit.";
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"Get sockname error: ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

int CPasvDataTransfer::GetIpAndPort(string &ip) {
    struct sockaddr_in sin;
    socklen_t  len = sizeof(sin);
    if(getsockname(m_Sock,(struct sockaddr*)&sin,&len) != 0){
        cout << "Get sockname error: " << strerror(errno) << endl;
        exit(-1);
    }
    struct ifaddrs *ifAddrStruct = NULL;
    void *tmpAddrPtr = NULL;

    getifaddrs(&ifAddrStruct);
    char addressBuffer[INET_ADDRSTRLEN];
    while(ifAddrStruct != NULL){
        if(ifAddrStruct->ifa_addr->sa_family == AF_INET){
            tmpAddrPtr = &((struct sockaddr_in *)ifAddrStruct->ifa_addr)->sin_addr;
            bzero(addressBuffer,INET_ADDRSTRLEN);
            inet_ntop(AF_INET,tmpAddrPtr,addressBuffer,INET_ADDRSTRLEN);
            if(strcmp(addressBuffer,"127.0.0.1") != 0 && strlen(addressBuffer) > 1)
                break;
        }
        ifAddrStruct = ifAddrStruct->ifa_next;
    }

    if(strlen(addressBuffer) > 1)
        ip = string(addressBuffer);
    else{
        cout << "Get local ip error,now exit." << endl;
        exit(-1);
    }
    return ntohs(sin.sin_port);
}